

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall
indigox::utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
ResetIndicies(Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
              *this)

{
  bool bVar1;
  type_conflict tVar2;
  param_type l;
  iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  *in_RDI;
  EdgeIterPair es;
  VertIterPair vs;
  param_type in_stack_ffffffffffffff58;
  iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
  *in_stack_ffffffffffffff60;
  iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  *in_stack_ffffffffffffff70;
  param_type in_stack_ffffffffffffffa0;
  container_adaptor<_facbf1eb_> *in_stack_ffffffffffffffa8;
  VertIterPair local_18;
  
  boost::bimaps::container_adaptor::container_adaptor<$facbf1eb$>::clear
            ((container_adaptor<_facbf1eb_> *)0x141585);
  boost::bimaps::container_adaptor::container_adaptor<$7d36b33f$>::clear
            ((container_adaptor<_7d36b33f_> *)0x141593);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  local_18 = GetVertices((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                          *)0x1415ad);
  while( true ) {
    bVar1 = std::operator!=(&local_18.first,&local_18.second);
    if (!bVar1) break;
    in_stack_ffffffffffffff60 =
         (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
          *)(in_RDI + 0x20);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_ffffffffffffff60);
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
    boost::bimaps::relation::
    mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
    ::mutant_relation((mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
                       *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x14161e);
    boost::bimaps::container_adaptor::container_adaptor<$facbf1eb$>::insert
              (in_stack_ffffffffffffffa8,(param_type)in_stack_ffffffffffffffa0);
    std::_List_iterator<void_*>::operator++(&local_18.first);
  }
  GetEdges((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *)
           0x141651);
  while( true ) {
    tVar2 = boost::iterators::operator!=(in_stack_ffffffffffffff70,in_RDI);
    if (!tVar2) break;
    l = (param_type)(in_RDI + 0x60);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator*(in_stack_ffffffffffffff60);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    boost::bimaps::relation::
    mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
    ::mutant_relation((mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
                       *)in_stack_ffffffffffffff60,l,0x1416b3);
    boost::bimaps::container_adaptor::container_adaptor<$7d36b33f$>::insert
              ((container_adaptor<_7d36b33f_> *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
    ;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator++(in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void ResetIndicies() {
        vert_idxmap_.clear();
        edge_idxmap_.clear();
        next_vert_id_ = 0;
        next_edge_id_ = 0;
        
        VertIterPair vs = GetVertices();
        while (vs.first != vs.second) {
          vert_idxmap_.insert({*vs.first, next_vert_id_++});
          ++vs.first;
        }
        
        EdgeIterPair es = GetEdges();
        while (es.first != es.second) {
          edge_idxmap_.insert({*es.first, next_edge_id_++});
          ++es.first;
        }
      }